

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

void __thiscall camp::Property::set(Property *this,UserObject *object,Value *value)

{
  bool bVar1;
  ForbiddenWrite *__return_storage_ptr__;
  string *propertyName;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [48];
  ForbiddenWrite local_68;
  Value *local_20;
  Value *value_local;
  UserObject *object_local;
  Property *this_local;
  
  local_20 = value;
  value_local = (Value *)object;
  object_local = (UserObject *)this;
  bVar1 = writable(this,object);
  if (!bVar1) {
    __return_storage_ptr__ = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
    propertyName = name_abi_cxx11_(this);
    ForbiddenWrite::ForbiddenWrite(&local_68,propertyName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/property.cpp"
               ,&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"void camp::Property::set(const UserObject &, const Value &) const",
               &local_c1);
    Error::prepare<camp::ForbiddenWrite>
              (__return_storage_ptr__,&local_68,(string *)local_98,0x53,(string *)local_c0);
    __cxa_throw(__return_storage_ptr__,&ForbiddenWrite::typeinfo,ForbiddenWrite::~ForbiddenWrite);
  }
  UserObject::set((UserObject *)value_local,this,local_20);
  return;
}

Assistant:

void Property::set(const UserObject& object, const Value& value) const
{
    // Check if the property is writable
    if (!writable(object))
        CAMP_ERROR(ForbiddenWrite(name()));

    // Here we don't call setValue directly, we rather let the user object do it
    // and add any processing needed for proper propagation of the modification
    object.set(*this, value);
}